

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileParser::ObjFileParser
          (ObjFileParser *this,IOStreamBuffer<char> *streamBuffer,string *modelName,IOSystem *io,
          ProgressHandler *progress,string *originalObjFileName)

{
  unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_> *this_00;
  mapped_type pMVar1;
  ulong __n;
  long lVar2;
  Model *pMVar3;
  Material *pMVar4;
  mapped_type *ppMVar5;
  
  this_00 = &this->m_pModel;
  *(undefined8 *)((long)&(this->m_DataItEnd)._M_current + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl + 4) = 0;
  (this->m_DataIt)._M_current = (char *)0x0;
  (this->m_DataItEnd)._M_current = (char *)0x0;
  this->m_pIO = io;
  this->m_progress = progress;
  std::__cxx11::string::string((string *)&this->m_originalObjFileName,(string *)originalObjFileName)
  ;
  for (lVar2 = 0x1c; lVar2 != 0x101c; lVar2 = lVar2 + 1) {
    this->m_buffer[lVar2 + -0x1c] = '\0';
  }
  pMVar3 = (Model *)operator_new(0x178);
  ObjFile::Model::Model(pMVar3);
  std::__uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::reset
            ((__uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
              *)this_00,pMVar3);
  std::__cxx11::string::_M_assign
            ((string *)
             (this_00->_M_t).
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl);
  pMVar4 = (Material *)operator_new(0x409c);
  ObjFile::Material::Material(pMVar4);
  ((this_00->_M_t).
   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>._M_t.
   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
   super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pDefaultMaterial = pMVar4
  ;
  __n = _DAT_008e5098;
  if (_DAT_008e5098 < 0x400) {
    pMVar4 = ((this_00->_M_t).
              super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
              .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
             m_pDefaultMaterial;
    (pMVar4->MaterialName).length = (int)_DAT_008e5098;
    memcpy((pMVar4->MaterialName).data,DEFAULT_MATERIAL_abi_cxx11_,__n);
    *(undefined1 *)((long)(pMVar4->MaterialName).data + __n) = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&((this_00->_M_t).
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_MaterialLib
              ,(value_type *)&DEFAULT_MATERIAL_abi_cxx11_);
  pMVar3 = (this_00->_M_t).
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
  pMVar1 = pMVar3->m_pDefaultMaterial;
  ppMVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
            ::operator[](&pMVar3->m_MaterialMap,(key_type *)&DEFAULT_MATERIAL_abi_cxx11_);
  *ppMVar5 = pMVar1;
  parseFile(this,streamBuffer);
  return;
}

Assistant:

ObjFileParser::ObjFileParser( IOStreamBuffer<char> &streamBuffer, const std::string &modelName,
                              IOSystem *io, ProgressHandler* progress,
                              const std::string &originalObjFileName) :
    m_DataIt(),
    m_DataItEnd(),
    m_pModel(nullptr),
    m_uiLine(0),
    m_pIO( io ),
    m_progress(progress),
    m_originalObjFileName(originalObjFileName)
{
    std::fill_n(m_buffer,Buffersize,0);

    // Create the model instance to store all the data
    m_pModel.reset(new ObjFile::Model());
    m_pModel->m_ModelName = modelName;

    // create default material and store it
    m_pModel->m_pDefaultMaterial = new ObjFile::Material;
    m_pModel->m_pDefaultMaterial->MaterialName.Set( DEFAULT_MATERIAL );
    m_pModel->m_MaterialLib.push_back( DEFAULT_MATERIAL );
    m_pModel->m_MaterialMap[ DEFAULT_MATERIAL ] = m_pModel->m_pDefaultMaterial;

    // Start parsing the file
    parseFile( streamBuffer );
}